

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cc
# Opt level: O1

string * __thiscall
phosg::format_time_abi_cxx11_(string *__return_storage_ptr__,phosg *this,uint64_t t)

{
  uint uVar1;
  size_t sVar2;
  runtime_error *prVar3;
  ulong __n;
  time_t t_secs;
  tm t_parsed;
  ulong local_68;
  tm local_60;
  
  local_68 = (ulong)this / 1000000;
  gmtime_r((time_t *)&local_68,&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (__return_storage_ptr__,0x80,'\0');
  sVar2 = strftime((__return_storage_ptr__->_M_dataplus)._M_p,
                   __return_storage_ptr__->_M_string_length,"%Y-%m-%d %H:%M:%S",&local_60);
  if (sVar2 == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar3,"format_time buffer too short");
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar1 = snprintf((__return_storage_ptr__->_M_dataplus)._M_p + sVar2,
                   __return_storage_ptr__->_M_string_length - sVar2,".%06u",(ulong)this % 1000000);
  if (-1 < (int)uVar1) {
    __n = sVar2 + uVar1;
    if (__return_storage_ptr__->_M_string_length < sVar2 + uVar1) {
      __n = __return_storage_ptr__->_M_string_length;
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,__n,'\0');
    return __return_storage_ptr__;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(prVar3,"cannot add microsecond field");
  __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string format_time(uint64_t t) {
  time_t t_secs = t / 1000000;
  struct tm t_parsed;
  gmtime_r(&t_secs, &t_parsed);

  string ret(128, 0);
  size_t len = strftime(ret.data(), ret.size(), "%Y-%m-%d %H:%M:%S", &t_parsed);
  if (len == 0) {
    throw runtime_error("format_time buffer too short");
  }
  int usecs_ret = snprintf(ret.data() + len, ret.size() - len, ".%06" PRIu32, static_cast<uint32_t>(t % 1000000));
  if (usecs_ret < 0) {
    throw runtime_error("cannot add microsecond field");
  }
  ret.resize(min<size_t>(len + usecs_ret, ret.size()));
  return ret;
}